

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obu.c
# Opt level: O3

aom_codec_err_t
aom_get_num_layers_from_operating_point_idc
          (int operating_point_idc,uint *number_spatial_layers,uint *number_temporal_layers)

{
  int iVar1;
  aom_codec_err_t aVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar8;
  int iVar9;
  int iVar10;
  int aiVar7 [4];
  long lVar11;
  undefined1 in_XMM5 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  
  aVar2 = AOM_CODEC_INVALID_PARAM;
  if (number_temporal_layers != (uint *)0x0 && number_spatial_layers != (uint *)0x0) {
    if (operating_point_idc == 0) {
      *number_temporal_layers = 1;
      *number_spatial_layers = 1;
    }
    else {
      *number_spatial_layers = 0;
      *number_temporal_layers = 0;
      *number_spatial_layers =
           ((uint)operating_point_idc >> 0xb & 1) + ((uint)operating_point_idc >> 9 & 1) +
           ((uint)operating_point_idc >> 10 & 1) +
           ((uint)operating_point_idc >> 8 & 1) + *number_spatial_layers;
      uVar3 = *number_temporal_layers;
      iVar4 = 0;
      iVar5 = 0;
      iVar6 = 0;
      iVar1 = 8;
      aiVar7 = quad_to_linear_1;
      do {
        auVar12 = pshuflw(in_XMM5,(undefined1  [16])aiVar7,0xfe);
        lVar11 = auVar12._0_8_;
        auVar14._0_4_ = (uint)operating_point_idc >> lVar11;
        auVar14._4_4_ = (uint)operating_point_idc >> lVar11;
        auVar14._8_4_ = (uint)operating_point_idc >> lVar11;
        auVar14._12_4_ = (uint)operating_point_idc >> lVar11;
        auVar12 = pshuflw(auVar12,(undefined1  [16])aiVar7,0x54);
        iVar8 = aiVar7[1];
        iVar9 = aiVar7[2];
        iVar10 = aiVar7[3];
        auVar13._0_8_ = aiVar7._8_8_;
        auVar13._8_4_ = iVar9;
        auVar13._12_4_ = iVar10;
        auVar15 = pshuflw(auVar14,auVar13,0xfe);
        in_XMM5 = pshuflw(auVar13,auVar13,0x54);
        uVar3 = uVar3 + ((uint)operating_point_idc >> auVar12._0_8_ & 1);
        iVar4 = iVar4 + (auVar14._4_4_ & 1);
        iVar5 = iVar5 + ((uint)operating_point_idc >> in_XMM5._0_8_ & 1);
        iVar6 = iVar6 + ((uint)operating_point_idc >> auVar15._0_8_ & 1);
        aiVar7[0] = aiVar7[0] + 4;
        aiVar7[1] = iVar8 + 4;
        aiVar7[2] = iVar9 + 4;
        aiVar7[3] = iVar10 + 4;
        iVar1 = iVar1 + -4;
      } while (iVar1 != 0);
      *number_temporal_layers = iVar6 + iVar4 + iVar5 + uVar3;
    }
    aVar2 = AOM_CODEC_OK;
  }
  return aVar2;
}

Assistant:

aom_codec_err_t aom_get_num_layers_from_operating_point_idc(
    int operating_point_idc, unsigned int *number_spatial_layers,
    unsigned int *number_temporal_layers) {
  // derive number of spatial/temporal layers from operating_point_idc

  if (!number_spatial_layers || !number_temporal_layers)
    return AOM_CODEC_INVALID_PARAM;

  if (operating_point_idc == 0) {
    *number_temporal_layers = 1;
    *number_spatial_layers = 1;
  } else {
    *number_spatial_layers = 0;
    *number_temporal_layers = 0;
    for (int j = 0; j < MAX_NUM_SPATIAL_LAYERS; j++) {
      *number_spatial_layers +=
          (operating_point_idc >> (j + MAX_NUM_TEMPORAL_LAYERS)) & 0x1;
    }
    for (int j = 0; j < MAX_NUM_TEMPORAL_LAYERS; j++) {
      *number_temporal_layers += (operating_point_idc >> j) & 0x1;
    }
  }

  return AOM_CODEC_OK;
}